

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lighting_database.cpp
# Opt level: O2

void LightingDb::prepare_light(GLuint p_shader_id)

{
  long *plVar1;
  allocator<char> local_41;
  vec3 local_40;
  string local_30;
  
  if (prepare_light(unsigned_int)::first == '\0') {
    prepare_light(unsigned_int)::first = '\x01';
    create_dir_light();
    create_point_light(0x100,0x100);
  }
  plVar1 = (long *)(dir_map + 0x10);
  while (plVar1 = (long *)*plVar1, plVar1 != (long *)0x0) {
    ShaderUtilities::attach_dir_light(p_shader_id,(DirectionalLight *)(plVar1 + 2));
  }
  plVar1 = (long *)(point_map + 0x10);
  while (plVar1 = (long *)*plVar1, plVar1 != (long *)0x0) {
    ShaderUtilities::attach_point_light(p_shader_id,(PointLight *)(plVar1 + 2));
  }
  ShaderUtilities::add_spot_light(p_shader_id,(bool)LightingDbWindow::enable_spot_light);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"far_plane",(allocator<char> *)&local_40);
  ShaderUtilities::setFloat(p_shader_id,&local_30,LightingDbWindow::far_plane);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"shadow_bias",(allocator<char> *)&local_40);
  ShaderUtilities::setFloat(p_shader_id,&local_30,LightingDbWindow::shadow_bias);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"enable_shadow",(allocator<char> *)&local_40);
  ShaderUtilities::setBool(p_shader_id,&local_30,(bool)LightingDbWindow::enable_shadow);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"enable_shadow_debug",(allocator<char> *)&local_40);
  ShaderUtilities::setBool(p_shader_id,&local_30,(bool)LightingDbWindow::enable_shadow_debug);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"camera_position",&local_41);
  local_40 = AkarinCameraSystem::get_position();
  ShaderUtilities::setVec3(p_shader_id,&local_30,&local_40);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void LightingDb::prepare_light(
    const GLuint p_shader_id) noexcept
{
    static bool first = true;
    if (first)
    {
        first = false;
        create_dir_light();
        create_point_light(256, 256);
    }
    for (const auto &dir_light : dir_map)
    {
        ShaderUtilities::attach_dir_light(
            p_shader_id,
            dir_light.second);
    };
    for (const auto &point_light : point_map)
    {
        ShaderUtilities::attach_point_light(
            p_shader_id,
            point_light.second);
    }
    ShaderUtilities::add_spot_light(
        p_shader_id,
        LightingDbWindow::enable_spot_light);

    // TODO :: Move this to PointLight
    ShaderUtilities::setFloat(
        p_shader_id,
        "far_plane",
        LightingDbWindow::far_plane);
    ShaderUtilities::setFloat(
        p_shader_id,
        "shadow_bias",
        LightingDbWindow::shadow_bias);
    ShaderUtilities::setBool(
        p_shader_id,
        "enable_shadow",
        LightingDbWindow::enable_shadow);
    ShaderUtilities::setBool(
        p_shader_id,
        "enable_shadow_debug",
        LightingDbWindow::enable_shadow_debug);
    ShaderUtilities::setVec3(
        p_shader_id,
        "camera_position",
        AkarinCameraSystem::get_position());
}